

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O2

Fl_Menu_Item * __thiscall Fl_Menu_Item::next(Fl_Menu_Item *this,int n)

{
  int iVar1;
  
  if (-1 < n) {
    iVar1 = n + (uint)(((uint)this->flags >> 4 & 1) != 0);
    while (iVar1 != 0) {
      this = next_visible_or_not(this);
      if (((this->flags & 0x10) == 0) || (this->text == (char *)0x0)) {
        iVar1 = iVar1 + -1;
      }
    }
    return this;
  }
  return (Fl_Menu_Item *)0x0;
}

Assistant:

const Fl_Menu_Item* Fl_Menu_Item::next(int n) const {
  if (n < 0) return 0; // this is so selected==-1 returns NULL
  const Fl_Menu_Item* m = this;
  if (!m->visible()) n++;
  while (n) {
    m = next_visible_or_not(m);
    if (m->visible() || !m->text) n--;
  }
  return m;
}